

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O1

void __thiscall QDebug::putString(QDebug *this,QChar *begin,size_t length)

{
  QChar *pQVar1;
  char16_t cVar2;
  char16_t cVar3;
  QTextStreamPrivate *this_00;
  bool bVar4;
  char *in_RCX;
  char *pcVar5;
  qsizetype runLength;
  void *pvVar6;
  char32_t ucs4;
  QChar *pQVar7;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QDebugStateSaver local_68;
  undefined2 local_5a;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->stream->noQuotes == true) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QTextStreamPrivate::putString
                ((this->stream->ts).d_ptr._M_t.
                 super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
                 .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl,begin,length,false
                );
      return;
    }
  }
  else {
    local_68.d._M_t.
    super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>.
    _M_t.
    super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>
    .super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
         (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
         &DAT_aaaaaaaaaaaaaaaa;
    QDebugStateSaver::QDebugStateSaver(&local_68,this);
    QTextStreamPrivate::Params::reset
              (&((this->stream->ts).d_ptr._M_t.
                 super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
                 .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl)->params);
    this_00 = (this->stream->ts).d_ptr._M_t.
              super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>.
              _M_t.
              super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
              .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
    local_5a = 0x22;
    QTextStreamPrivate::write(this_00,(int)&local_5a,(void *)0x1,(size_t)in_RCX);
    if (length != 0) {
      pQVar1 = begin + length;
      do {
        pvVar6 = (void *)0x0;
        pQVar7 = begin;
        do {
          cVar2 = pQVar7->ucs;
          bVar4 = QChar::isPrint((uint)(ushort)cVar2);
          if (((!bVar4) || ((uint)(ushort)cVar2 == L'\"')) || (cVar2 == L'\\')) break;
          pvVar6 = (void *)((long)pvVar6 + 1);
          pQVar7 = pQVar7 + 1;
        } while (pQVar7 != pQVar1);
        if (pvVar6 == (void *)0x0) {
          uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
          local_48 = 0xaaaaaaaa;
          local_58._0_2_ = 0x5c;
          local_58._2_6_ = 0xaaaaaaaaaaaa;
          cVar2 = begin->ucs;
          pcVar5 = (char *)(ulong)((ushort)cVar2 - 8);
          if (5 < (ushort)cVar2 - 8) {
            if ((cVar2 != L'\\') && (cVar2 != L'\"')) goto switchD_002235a6_caseD_b;
            local_58._0_4_ = CONCAT22(cVar2,0x5c);
            local_58 = CONCAT44(0xaaaaaaaa,(undefined4)local_58);
            in_RCX = pcVar5;
            goto LAB_002236a8;
          }
          in_RCX = (char *)((long)&switchD_002235a6::switchdataD_004da1c0 +
                           (long)(int)(&switchD_002235a6::switchdataD_004da1c0)[(long)pcVar5]);
          switch(pcVar5) {
          case (char *)0x0:
            local_58 = 0xaaaaaaaa0062005c;
            break;
          case (char *)0x1:
            local_58 = 0xaaaaaaaa0074005c;
            break;
          case (char *)0x2:
            local_58 = 0xaaaaaaaa006e005c;
            break;
          case (char *)0x3:
switchD_002235a6_caseD_b:
            if (((cVar2 & 0xfc00U) == 0xd800) && (pQVar7 = begin + 1, pQVar7 != pQVar1)) {
              cVar3 = pQVar7->ucs;
              in_RCX = (char *)(ulong)((ushort)cVar3 & 0xfc00);
              if (((ushort)cVar3 & 0xfc00) != 0xdc00) goto LAB_0022362d;
              ucs4 = (uint)(ushort)cVar2 * 0x400 + (uint)(ushort)cVar3 + L'\xfca02400';
              bVar4 = QChar::isPrint(ucs4);
              begin = pQVar7;
              if (bVar4) {
                local_58._0_4_ = CONCAT22(cVar3,cVar2);
                break;
              }
              local_58._0_6_ = CONCAT42(0x300055,(undefined2)local_58);
              local_58 = CONCAT26(0x30,(undefined6)local_58);
              in_RCX = "0123456789ABCDEF";
              uStack_50._0_4_ =
                   CONCAT22((short)"0123456789ABCDEF"[(uint)ucs4 >> 0x10 & 0xf],
                            (short)"0123456789ABCDEF"[(uint)ucs4 >> 0x14]);
              uStack_50 = (undefined1 *)
                          CONCAT26((short)"0123456789ABCDEF"[(uint)ucs4 >> 8 & 0xf],
                                   CONCAT24((short)"0123456789ABCDEF"[(uint)ucs4 >> 0xc & 0xf],
                                            (undefined4)uStack_50));
              local_48 = CONCAT22((short)"0123456789ABCDEF"[(ushort)cVar3 & 0xf],
                                  (short)"0123456789ABCDEF"[(ushort)cVar3 >> 4 & 0xf]);
              pvVar6 = (void *)0xa;
            }
            else {
LAB_0022362d:
              in_RCX = "0123456789ABCDEF";
              local_58._0_6_ =
                   CONCAT24((short)"0123456789ABCDEF"[(ushort)begin->ucs >> 0xc],0x75005c);
              local_58 = CONCAT26((short)"0123456789ABCDEF"[*(byte *)((long)&begin->ucs + 1) & 0xf],
                                  (undefined6)local_58);
              uStack_50._0_4_ =
                   CONCAT22((short)"0123456789ABCDEF"[(ushort)begin->ucs & 0xf],
                            (short)"0123456789ABCDEF"[(ushort)begin->ucs >> 4 & 0xf]);
              uStack_50 = (undefined1 *)CONCAT44(0xaaaaaaaa,(undefined4)uStack_50);
              pvVar6 = (void *)0x6;
            }
            goto LAB_002236ad;
          case (char *)0x4:
            local_58 = 0xaaaaaaaa0066005c;
            break;
          case (char *)0x5:
            local_58 = 0xaaaaaaaa0072005c;
          }
LAB_002236a8:
          pvVar6 = (void *)0x2;
LAB_002236ad:
          QTextStreamPrivate::write(this_00,(int)&local_58,pvVar6,(size_t)in_RCX);
        }
        else {
          QTextStreamPrivate::write(this_00,(int)begin,pvVar6,(size_t)in_RCX);
          begin = begin + (long)pvVar6 + -1;
        }
        begin = begin + 1;
      } while (begin != pQVar1);
    }
    QTextStreamPrivate::write(this_00,(int)&local_5a,(void *)0x1,(size_t)in_RCX);
    QDebugStateSaver::~QDebugStateSaver(&local_68);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QDebug::putString(const QChar *begin, size_t length)
{
    if (stream->noQuotes) {
        // no quotes, write the string directly too (no pretty-printing)
        // this respects the QTextStream state, though
        stream->ts.d_ptr->putString(begin, qsizetype(length));
    } else {
        // we'll reset the QTextStream formatting mechanisms, so save the state
        QDebugStateSaver saver(*this);
        stream->ts.d_ptr->params.reset();
        putEscapedString(stream->ts.d_ptr.get(), reinterpret_cast<const char16_t *>(begin), length);
    }
}